

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunction * duckdb::AsinFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe9c;
  FunctionNullHandling in_stack_fffffffffffffea8;
  allocator_type local_151;
  code *bind_lambda;
  LogicalType local_130;
  LogicalType local_118;
  vector<duckdb::LogicalType,_true> local_100;
  LogicalType local_e8;
  BaseScalarFunction local_d0;
  
  LogicalType::LogicalType(&local_118,DOUBLE);
  __l._M_len = 1;
  __l._M_array = &local_118;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_100,__l,
             &local_151);
  LogicalType::LogicalType(&local_130,DOUBLE);
  bind_lambda = ScalarFunction::
                UnaryFunction<double,double,duckdb::NoInfiniteDoubleWrapper<duckdb::ASinOperator>>;
  LogicalType::LogicalType(&local_e8,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_e8;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffe94;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffe9c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_100,&local_130,(scalar_function_t *)&stack0xfffffffffffffeb0,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffffea8,bind_lambda);
  LogicalType::~LogicalType(&local_e8);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xfffffffffffffeb0,(_Any_data *)&stack0xfffffffffffffeb0,
               __destroy_functor);
  LogicalType::~LogicalType(&local_130);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_100);
  LogicalType::~LogicalType(&local_118);
  BaseScalarFunction::SetReturnsError(&local_d0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction AsinFun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, NoInfiniteDoubleWrapper<ASinOperator>>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}